

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

uint32_t __thiscall cfd::core::Transaction::GetWeight(Transaction *this)

{
  void *pvVar1;
  CfdException *this_00;
  int iStack_4c;
  size_t sStack_48;
  undefined1 auStack_40 [32];
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if ((*(long *)((long)pvVar1 + 0x10) == 0) && (*(long *)((long)pvVar1 + 0x28) == 0)) {
    return 0x28;
  }
  sStack_48 = 0;
  iStack_4c = wally_tx_get_weight((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,
                                  &sStack_48);
  if (iStack_4c == 0) {
    return (uint32_t)sStack_48;
  }
  auStack_40._0_8_ = "cfdcore_transaction_common.cpp";
  auStack_40._8_4_ = 0x254;
  auStack_40._16_8_ = "GetWeight";
  logger::log<int&>((CfdSourceLocation *)auStack_40,kCfdLogLevelWarning,
                    "wally_tx_get_weight NG[{}].",&iStack_4c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  auStack_40._0_8_ = auStack_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_40,"transaction weight calc error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)auStack_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::GetWeight() const {
  size_t weight = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  // If both input / output are 0, libwally misidentifies as ElementsTransaction
  if ((tx_pointer->num_inputs == 0) && (tx_pointer->num_outputs == 0)) {
    weight = static_cast<size_t>(kTransactionMinimumSize) * 4;
  } else {
    weight = AbstractTransaction::GetWeight();
  }
  return static_cast<uint32_t>(weight);
}